

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamStandardIndex::Create(BamStandardIndex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pBVar2;
  bool bVar3;
  int iVar4;
  uint64_t uVar5;
  int64_t iVar6;
  ostream *poVar7;
  long *plVar8;
  uint uVar9;
  BamReaderPrivate *pBVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  uint32_t currentBin;
  uint64_t lastOffset;
  uint64_t currentOffset;
  BaiReferenceEntry refEntry;
  string readerError;
  string indexFilename;
  string message;
  uint32_t local_3f4;
  uint64_t local_3f0;
  int local_3e8;
  uint local_3e4;
  uint64_t local_3e0;
  uint64_t local_3d8;
  uint64_t local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [8];
  undefined1 local_398 [32];
  pointer local_378;
  BaiLinearOffsetVector BStack_370;
  undefined1 local_358 [8];
  undefined1 auStack_350 [8];
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  pointer local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_320;
  _Alloc_hider _Stack_310;
  ios_base local_2d8 [272];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  undefined1 local_1b8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  _Alloc_hider local_188;
  undefined4 local_e0;
  undefined4 local_dc;
  ushort local_d8;
  
  pBVar10 = (this->super_BamIndex).m_reader;
  if ((pBVar10 == (BamReaderPrivate *)0x0) || (bVar3 = BamReaderPrivate::IsOpen(pBVar10), !bVar3)) {
    local_358 = (undefined1  [8])local_348;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_358,"BamStandardIndex::Create","");
    local_188._M_p = &stack0xfffffffffffffe88;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&stack0xfffffffffffffe78,"could not create index: reader is not open","");
    BamIndex::SetErrorString
              (&this->super_BamIndex,(string *)local_358,(string *)&stack0xfffffffffffffe78);
    if (local_188._M_p != &stack0xfffffffffffffe88) {
      operator_delete(local_188._M_p);
    }
    if (local_358 == (undefined1  [8])local_348) {
      return false;
    }
  }
  else {
    bVar3 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
    if (bVar3) {
      BamReaderPrivate::Filename_abi_cxx11_((string *)local_358,(this->super_BamIndex).m_reader);
      local_188._M_p = &stack0xfffffffffffffe88;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xfffffffffffffe78,BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p,
                 BAI_EXTENSION_abi_cxx11_._M_dataplus._M_p +
                 BAI_EXTENSION_abi_cxx11_._M_string_length);
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe78);
      if (local_188._M_p != &stack0xfffffffffffffe88) {
        operator_delete(local_188._M_p);
      }
      if (local_358 != (undefined1  [8])local_348) {
        operator_delete((void *)local_358);
      }
      OpenFile(this,&local_1a8,ReadWrite);
      local_3e8 = BamReaderPrivate::GetReferenceCount((this->super_BamIndex).m_reader);
      pBVar2 = (this->m_indexFileSummary).
               super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->m_indexFileSummary).
          super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
          ._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
        (this->m_indexFileSummary).
        super__Vector_base<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
        ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
      }
      local_358 = (undefined1  [8])0x0;
      auStack_350 = (undefined1  [8])0x0;
      local_348._0_8_ = 0;
      std::
      vector<BamTools::Internal::BaiReferenceSummary,_std::allocator<BamTools::Internal::BaiReferenceSummary>_>
      ::_M_fill_assign(&this->m_indexFileSummary,(long)local_3e8,(value_type *)local_358);
      WriteHeader(this);
      local_3f4 = 0xffffffff;
      uVar5 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
      local_3e0 = uVar5;
      local_3d8 = uVar5;
      BamAlignment::BamAlignment((BamAlignment *)&stack0xfffffffffffffe78);
      local_398._16_8_ = local_398;
      local_3a8._0_4_ = -1;
      local_398._0_4_ = _S_red;
      local_398._8_8_ = (_Base_ptr)0x0;
      local_378 = (pointer)0x0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_3e4 = 0xffffffff;
      uVar9 = 0xffffffff;
      uVar11 = -1;
      uVar12 = -1;
      uVar13 = -1;
      local_3f0 = uVar5;
      local_3d0 = uVar5;
      local_398._24_8_ = local_398._16_8_;
      while( true ) {
        pBVar10 = (this->super_BamIndex).m_reader;
        bVar3 = BamReaderPrivate::LoadNextAlignment
                          (pBVar10,(BamAlignment *)&stack0xfffffffffffffe78);
        if (!bVar3) break;
        if (uVar12 == local_e0) {
          if ((int)local_dc < (int)uVar13) {
            paVar1 = &local_3c8.field_2;
            local_3c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"");
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_358,(string *)&local_3c8,_S_out|_S_in);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_348,"BAM file is not properly sorted by coordinate",0x2d);
            std::ios::widen((char)*(undefined8 *)(local_348._0_8_ - 0x18) + (char)local_348);
            std::ostream::put((char)local_348);
            poVar7 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"Current alignment position: ",0x1c);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,local_dc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," < previous alignment position: ",0x20);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar13);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," on reference ID: ",0x12);
            plVar8 = (long *)std::ostream::operator<<((ostream *)poVar7,local_e0);
            std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
            std::ostream::put((char)plVar8);
            std::ostream::flush();
            local_3c8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_3c8,"BamStandardIndex::Create","");
            std::__cxx11::stringbuf::str();
            BamIndex::SetErrorString(&this->super_BamIndex,&local_3c8,(string *)&local_1c8);
            if ((undefined1 *)local_1c8._M_allocated_capacity != local_1b8) {
              operator_delete((void *)local_1c8._M_allocated_capacity);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_3c8._M_dataplus._M_p);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_358);
            std::ios_base::~ios_base(local_2d8);
            bVar3 = false;
            goto LAB_00140a14;
          }
        }
        else {
          if (uVar12 == -1) {
            if (0 < (int)local_e0) {
              iVar4 = 0;
              do {
                local_358._0_4_ = iVar4;
                local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
                local_348._8_8_ = 0;
                local_338._M_allocated_capacity = (size_type)local_348;
                aStack_320._8_8_ = 0;
                _Stack_310._M_p = (pointer)0x0;
                local_328 = (pointer)0x0;
                aStack_320._M_allocated_capacity = 0;
                local_338._8_8_ = local_338._M_allocated_capacity;
                WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
                WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
                if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                  operator_delete((void *)aStack_320._M_allocated_capacity);
                }
                pBVar10 = (BamReaderPrivate *)auStack_350;
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                             *)pBVar10);
                iVar4 = iVar4 + 1;
              } while (iVar4 < (int)local_e0);
            }
          }
          else {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)pBVar10,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                       &local_3e0);
            WriteBins(this,(int *)local_3a8,(BaiBinMap *)local_3a0);
            WriteLinearOffsets(this,(int *)local_3a8,&BStack_370);
            local_3a8._0_4_ = -1;
            pBVar10 = (BamReaderPrivate *)local_3a0;
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
            ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                     *)pBVar10);
            if (BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_finish !=
                BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                .super__Vector_impl_data._M_start) {
              BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
            }
            iVar4 = uVar12 + 1;
            if (iVar4 < (int)local_e0) {
              do {
                local_358._0_4_ = iVar4;
                local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
                local_348._8_8_ = 0;
                local_338._M_allocated_capacity = (size_type)local_348;
                aStack_320._8_8_ = 0;
                _Stack_310._M_p = (pointer)0x0;
                local_328 = (pointer)0x0;
                aStack_320._M_allocated_capacity = 0;
                local_338._8_8_ = local_338._M_allocated_capacity;
                WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
                WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
                if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
                  operator_delete((void *)aStack_320._M_allocated_capacity);
                }
                pBVar10 = (BamReaderPrivate *)auStack_350;
                std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                             *)auStack_350);
                iVar4 = iVar4 + 1;
              } while (iVar4 < (int)local_e0);
            }
            local_3d8 = local_3f0;
            local_3f4 = (uint32_t)local_d8;
            local_3d0 = local_3f0;
            local_3e4 = local_3f4;
            uVar11 = local_e0;
          }
          uVar9 = 0xffffffff;
          uVar12 = local_e0;
          local_3a8._0_4_ = local_e0;
        }
        if (local_d8 < 0x1249 && -1 < (int)uVar12) {
          pBVar10 = (BamReaderPrivate *)&stack0xfffffffffffffe78;
          iVar4 = BamAlignment::GetEndPosition((BamAlignment *)pBVar10,false,false);
          local_358._0_4_ = iVar4;
          SaveLinearOffsetEntry
                    ((BamStandardIndex *)pBVar10,&BStack_370,&stack0xffffffffffffff24,
                     (int *)local_358,&local_3e0);
        }
        if (uVar9 != local_d8) {
          if (local_3e4 != 0xffffffff) {
            SaveAlignmentChunkToBin
                      ((BamStandardIndex *)pBVar10,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                       &local_3e0);
          }
          uVar9 = (uint)local_d8;
          local_3d8 = local_3f0;
          local_3d0 = local_3f0;
          uVar11 = local_e0;
          local_3f4 = uVar9;
          local_3e4 = uVar9;
          if ((int)local_e0 < 0) break;
        }
        iVar6 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        if (iVar6 <= (long)local_3f0) {
          local_358 = (undefined1  [8])local_348;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_358,"BamStandardIndex::Create","");
          local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_3c8,"calculating offsets failed","");
          BamIndex::SetErrorString(&this->super_BamIndex,(string *)local_358,&local_3c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
            operator_delete(local_3c8._M_dataplus._M_p);
          }
          if (local_358 != (undefined1  [8])local_348) {
            operator_delete((void *)local_358);
          }
          bVar3 = false;
          goto LAB_00140a14;
        }
        local_3f0 = BamReaderPrivate::Tell((this->super_BamIndex).m_reader);
        uVar13 = local_dc;
        local_3e0 = local_3f0;
      }
      if (local_3f0 != local_3d0) {
        SaveAlignmentChunkToBin
                  ((BamStandardIndex *)pBVar10,(BaiBinMap *)local_3a0,&local_3f4,&local_3d8,
                   &local_3e0);
        WriteBins(this,(int *)local_3a8,(BaiBinMap *)local_3a0);
        WriteLinearOffsets(this,(int *)local_3a8,&BStack_370);
      }
      iVar4 = uVar11 + 1;
      bVar3 = true;
      if (iVar4 < local_3e8) {
        do {
          local_358._0_4_ = iVar4;
          local_348._0_8_ = local_348._0_8_ & 0xffffffff00000000;
          local_348._8_8_ = 0;
          local_338._M_allocated_capacity = (size_type)local_348;
          aStack_320._8_8_ = 0;
          _Stack_310._M_p = (pointer)0x0;
          local_328 = (pointer)0x0;
          aStack_320._M_allocated_capacity = 0;
          local_338._8_8_ = local_338._M_allocated_capacity;
          WriteBins(this,(int *)local_358,(BaiBinMap *)auStack_350);
          WriteLinearOffsets(this,(int *)local_358,(BaiLinearOffsetVector *)&aStack_320);
          if ((void *)aStack_320._M_allocated_capacity != (void *)0x0) {
            operator_delete((void *)aStack_320._M_allocated_capacity);
          }
          std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                       *)auStack_350);
          iVar4 = iVar4 + 1;
        } while (local_3e8 != iVar4);
        bVar3 = true;
      }
LAB_00140a14:
      if ((pointer)BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_370.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>_>_>_>
                   *)local_3a0);
      BamAlignment::~BamAlignment((BamAlignment *)&stack0xfffffffffffffe78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p);
      }
      if (!bVar3) {
        return false;
      }
      bVar3 = BamReaderPrivate::Rewind((this->super_BamIndex).m_reader);
      if (bVar3) {
        return true;
      }
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe78,"could not create index: \n\t",(string *)local_358);
      local_3a8 = (undefined1  [8])local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString
                (&this->super_BamIndex,(string *)local_3a8,(string *)&stack0xfffffffffffffe78);
      if (local_3a8 != (undefined1  [8])local_398) {
        operator_delete((void *)local_3a8);
      }
      if (local_188._M_p != &stack0xfffffffffffffe88) {
        operator_delete(local_188._M_p);
      }
    }
    else {
      BamReaderPrivate::GetErrorString_abi_cxx11_
                ((string *)local_358,(this->super_BamIndex).m_reader);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xfffffffffffffe78,"could not create index: \n\t",(string *)local_358);
      local_3a8 = (undefined1  [8])local_398;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_3a8,"BamStandardIndex::Create","");
      BamIndex::SetErrorString
                (&this->super_BamIndex,(string *)local_3a8,(string *)&stack0xfffffffffffffe78);
      if (local_3a8 != (undefined1  [8])local_398) {
        operator_delete((void *)local_3a8);
      }
      if (local_188._M_p != &stack0xfffffffffffffe88) {
        operator_delete(local_188._M_p);
      }
    }
    if (local_358 == (undefined1  [8])local_348) {
      return false;
    }
  }
  operator_delete((void *)local_358);
  return false;
}

Assistant:

bool BamStandardIndex::Create(void) {

    // skip if BamReader is invalid or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamStandardIndex::Create", "could not create index: reader is not open");
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    try {

        // open new index file (read & write)
        string indexFilename = m_reader->Filename() + Extension();
        OpenFile(indexFilename, IBamIODevice::ReadWrite);

        // initialize BaiFileSummary with number of references
        const int& numReferences = m_reader->GetReferenceCount();
        ReserveForSummary(numReferences);

        // initialize output file
        WriteHeader();

        // set up bin, ID, offset, & coordinate markers
        const uint32_t defaultValue = 0xffffffffu;
        uint32_t currentBin    = defaultValue;
        uint32_t lastBin       = defaultValue;
        int32_t  currentRefID  = defaultValue;
        int32_t  lastRefID     = defaultValue;
        uint64_t currentOffset = (uint64_t)m_reader->Tell();
        uint64_t lastOffset    = currentOffset;
        int32_t  lastPosition  = defaultValue;

        // iterate through alignments in BAM file
        BamAlignment al;
        BaiReferenceEntry refEntry;
        while ( m_reader->LoadNextAlignment(al) ) {

            // changed to new reference
            if ( lastRefID != al.RefID ) {

                // if not first reference, save previous reference data
                if ( lastRefID != (int32_t)defaultValue ) {

                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
                    WriteReferenceEntry(refEntry);
                    ClearReferenceEntry(refEntry);

                    // write any empty references between (but *NOT* including) lastRefID & al.RefID
                    for ( int i = lastRefID+1; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }

                    // update bin markers
                    currentOffset = lastOffset;
                    currentBin    = al.Bin;
                    lastBin       = al.Bin;
                    currentRefID  = al.RefID;
                }

                // otherwise, this is first pass
                // be sure to write any empty references up to (but *NOT* including) current RefID
                else {
                    for ( int i = 0; i < al.RefID; ++i ) {
                        BaiReferenceEntry emptyEntry(i);
                        WriteReferenceEntry(emptyEntry);
                    }
                }

                // update reference markers
                refEntry.ID = al.RefID;
                lastRefID   = al.RefID;
                lastBin     = defaultValue;
            }

            // if lastPosition greater than current alignment position - file not sorted properly
            else if ( lastPosition > al.Position ) {
                stringstream s("");
                s << "BAM file is not properly sorted by coordinate" << endl
                  << "Current alignment position: " << al.Position
                  << " < previous alignment position: " << lastPosition
                  << " on reference ID: " << al.RefID << endl;
                SetErrorString("BamStandardIndex::Create", s.str());
                return false;
            }

            // if alignment's ref ID is valid & its bin is not a 'leaf'
            if ( (al.RefID >= 0) && (al.Bin < 4681) )
                SaveLinearOffsetEntry(refEntry.LinearOffsets, al.Position, al.GetEndPosition(), lastOffset);

            // changed to new BAI bin
            if ( al.Bin != lastBin ) {

                // if not first bin on reference, save previous bin data
                if ( currentBin != defaultValue )
                    SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);

                // update markers
                currentOffset = lastOffset;
                currentBin    = al.Bin;
                lastBin       = al.Bin;
                currentRefID  = al.RefID;

                // if invalid RefID, break out
                if ( currentRefID < 0 )
                    break;
            }

            // make sure that current file pointer is beyond lastOffset
            if ( m_reader->Tell() <= (int64_t)lastOffset ) {
                SetErrorString("BamStandardIndex::Create", "calculating offsets failed");
                return false;
            }

            // update lastOffset & lastPosition
            lastOffset   = m_reader->Tell();
            lastPosition = al.Position;
        }

        // after finishing alignments, if any data was read, check:
        if ( lastOffset != currentOffset ) {

            // store last alignment chunk to its bin, then write last reference entry with data
            SaveAlignmentChunkToBin(refEntry.Bins, currentBin, currentOffset, lastOffset);
            WriteReferenceEntry(refEntry);
        }

        // then write any empty references remaining at end of file
        for ( int i = currentRefID+1; i < numReferences; ++i ) {
            BaiReferenceEntry emptyEntry(i);
            WriteReferenceEntry(emptyEntry);
        }

    } catch ( BamException& e) {
        m_errorString = e.what();
        return false;
    }

    // rewind BamReader
    if ( !m_reader->Rewind() ) {
        const string readerError = m_reader->GetErrorString();
        const string message = "could not create index: \n\t" + readerError;
        SetErrorString("BamStandardIndex::Create", message);
        return false;
    }

    // return success
    return true;
}